

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::DescriptorPoolFeaturesTest_NotStrictlyIncreasing_Test::
~DescriptorPoolFeaturesTest_NotStrictlyIncreasing_Test
          (DescriptorPoolFeaturesTest_NotStrictlyIncreasing_Test *this)

{
  ValidationErrorTest::~ValidationErrorTest(&this->super_DescriptorPoolFeaturesTest);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(DescriptorPoolFeaturesTest, NotStrictlyIncreasing) {
  FeatureSetDefaults defaults = ParseTextOrDie(R"pb(
    defaults {
      edition: EDITION_PROTO3
      overridable_features {}
    }
    defaults {
      edition: EDITION_PROTO2
      overridable_features {}
    }
    minimum_edition: EDITION_PROTO2
    maximum_edition: EDITION_2023
  )pb");
  EXPECT_THAT(
      pool_.SetFeatureSetDefaults(std::move(defaults)),
      StatusIs(
          absl::StatusCode::kInvalidArgument,
          AllOf(
              HasSubstr("not strictly increasing"),
              HasSubstr("PROTO3 is greater than or equal to edition PROTO2"))));
}